

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

Node * __thiscall wasm::DataFlow::Graph::doVisitLoop(Graph *this,Loop *curr)

{
  Locals *__x;
  mapped_type pEVar1;
  Node *other;
  Node *pNVar2;
  Node *this_00;
  __uniq_ptr_impl<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_> _Var3;
  undefined8 *puVar4;
  pointer ppNVar5;
  bool bVar6;
  Node **node;
  mapped_type *ppEVar7;
  size_t sVar8;
  Type TVar9;
  Node *pNVar10;
  ulong uVar11;
  ulong uVar12;
  pointer ppNVar13;
  pointer puVar14;
  pointer puVar15;
  Node *pNVar16;
  ulong uVar17;
  undefined8 *puVar18;
  undefined1 local_90 [8];
  Locals vars;
  undefined1 local_68 [8];
  Locals previous;
  
  pEVar1 = this->parent;
  local_68 = (undefined1  [8])curr;
  ppEVar7 = std::__detail::
            _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->expressionParentMap,(key_type *)local_68);
  *ppEVar7 = pEVar1;
  this->parent = (Expression *)curr;
  if ((this->locals).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->locals).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((curr->name).super_IString.str._M_str == (char *)0x0) {
      Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->body);
    }
    else {
      __x = &this->locals;
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::vector
                ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)local_68
                 ,__x);
      sVar8 = Function::getNumLocals(this->func);
      if (sVar8 != 0) {
        uVar11 = 0;
        do {
          TVar9 = Function::getLocalType(this->func,(Index)uVar11);
          pNVar10 = makeVar(this,TVar9);
          (__x->super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>)
          ._M_impl.super__Vector_impl_data._M_start[uVar11] = pNVar10;
          uVar11 = (ulong)((Index)uVar11 + 1);
        } while (uVar11 < sVar8);
      }
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::vector
                ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)local_90
                 ,__x);
      previous.super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)(this->nodes).
                           super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->nodes).
                          super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->body);
      vars.super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->breakStates,&curr->name);
      if (sVar8 != 0) {
        uVar11 = (long)previous.
                       super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3;
        uVar17 = 0;
        do {
          TVar9 = Function::getLocalType(this->func,(Index)uVar17);
          if ((TVar9.id & 0xfffffffffffffffe) == 2) {
            pNVar10 = *(pointer)((long)local_90 + uVar17 * 8);
            other = *(Node **)(&(((SpecificExpression<(wasm::Expression::Id)3> *)local_68)->
                                super_Expression)._id + uVar17 * 8);
            pNVar2 = vars.
                     super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[1];
            for (pNVar16 = *vars.
                            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage; pNVar16 != pNVar2;
                pNVar16 = (Node *)&pNVar16->values) {
              if (*(Expression **)pNVar16 == (pNVar16->field_1).expr) {
                __assert_fail("!isInUnreachable(other)",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/graph.h"
                              ,0x14e,"Node *wasm::DataFlow::Graph::doVisitLoop(Loop *)");
              }
              this_00 = *(Node **)(&(*(Expression **)pNVar16)->_id + uVar17 * 8);
              bVar6 = Node::operator==(this_00,pNVar10);
              if (!bVar6) {
                bVar6 = Node::operator==(this_00,other);
                if (!bVar6) goto LAB_008283ac;
              }
            }
            puVar14 = (this->nodes).
                      super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar15 = (this->nodes).
                      super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            uVar12 = uVar11;
            if (previous.
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage <
                (pointer)((long)puVar15 - (long)puVar14)) {
              do {
                _Var3._M_t.
                super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
                .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl =
                     puVar14[uVar12]._M_t.
                     super___uniq_ptr_impl<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>
                     ._M_t;
                puVar18 = *(undefined8 **)
                           ((long)_Var3._M_t.
                                  super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
                                  .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl
                           + 0x18);
                puVar4 = *(undefined8 **)
                          ((long)_Var3._M_t.
                                 super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
                                 .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl
                          + 0x20);
                if (puVar18 != puVar4) {
                  do {
                    if ((Node *)*puVar18 == pNVar10) {
                      *puVar18 = other;
                    }
                    puVar18 = puVar18 + 1;
                  } while (puVar18 != puVar4);
                  puVar14 = (this->nodes).
                            super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar15 = (this->nodes).
                            super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 < (ulong)((long)puVar15 - (long)puVar14 >> 3));
            }
            ppNVar5 = (this->locals).
                      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppNVar13 = (this->locals).
                            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppNVar13 != ppNVar5;
                ppNVar13 = ppNVar13 + 1) {
              if (*ppNVar13 == pNVar10) {
                *ppNVar13 = other;
              }
            }
          }
LAB_008283ac:
          uVar17 = (ulong)((Index)uVar17 + 1);
        } while (uVar17 < sVar8);
      }
      if (local_90 != (undefined1  [8])0x0) {
        operator_delete((void *)local_90,
                        (long)vars.
                              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_90);
      }
      if (local_68 != (undefined1  [8])0x0) {
        operator_delete((void *)local_68,
                        (long)previous.
                              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_68);
      }
    }
  }
  return &this->bad;
}

Assistant:

Node* doVisitLoop(Loop* curr) {
    auto* oldParent = parent;
    expressionParentMap[curr] = oldParent;
    parent = curr;
    // As in Souper's LLVM extractor, we avoid loop phis, as we don't want
    // our traces to represent a value that differs across loop iterations.
    // For example,
    //   %b = block
    //   %x = phi %b, 1, %y
    //   %y = phi %b, 2, %x
    //   %z = eq %x %y
    //   infer %z
    // Here %y refers to the previous iteration's %x.
    // To do this, we set all locals to a Var at the loop entry, then process
    // the inside of the loop. When that is done, we can see if a phi was
    // actually needed for each local. If it was, we leave the Var (it
    // represents an unknown value; analysis stops there), and if not, we
    // can replace the Var with the fixed value.
    // TODO: perhaps some more general uses of DataFlow will want loop phis?
    // TODO: optimize stuff here
    if (isInUnreachable()) {
      return &bad; // none of this matters
    }
    if (!curr->name.is()) {
      visit(curr->body);
      return &bad; // no phis are possible
    }
    auto previous = locals;
    auto numLocals = func->getNumLocals();
    for (Index i = 0; i < numLocals; i++) {
      locals[i] = makeVar(func->getLocalType(i));
    }
    auto vars = locals; // all the Vars we just created
    // We may need to replace values later - only new nodes added from
    // here are relevant.
    auto firstNodeFromLoop = nodes.size();
    // Process the loop body.
    visit(curr->body);
    // Find all incoming paths.
    auto& breaks = breakStates[curr->name];
    // Phis are possible, check for them.
    for (Index i = 0; i < numLocals; i++) {
      if (!isRelevantType(func->getLocalType(i))) {
        continue;
      }
      bool needPhi = false;
      // We replaced the proper value with a Var. If it's still that
      // Var - or it's the original proper value, which can happen with
      // constants - on all incoming paths, then a phi is not needed.
      auto* var = vars[i];
      auto* proper = previous[i];
      for (auto& other : breaks) {
        assert(!isInUnreachable(other));
        auto& curr = *(other[i]);
        if (curr != *var && curr != *proper) {
          // A phi would be necessary here.
          needPhi = true;
          break;
        }
      }
      if (needPhi) {
        // Nothing to do - leave the Vars, the loop phis are
        // unknown values to us.
      } else {
        // Undo the Var for this local: In every new node added for
        // the loop body, replace references to the Var with the
        // previous value (the value that is all we need instead of a phi).
        for (auto j = firstNodeFromLoop; j < nodes.size(); j++) {
          for (auto*& value : nodes[j].get()->values) {
            if (value == var) {
              value = proper;
            }
          }
        }
        // Also undo in the current local state, which is flowing out
        // of the loop.
        for (auto*& node : locals) {
          if (node == var) {
            node = proper;
          }
        }
      }
    }
    return &bad;
  }